

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValueStorage.hpp
# Opt level: O0

int __thiscall
supermap::
KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
::remove(KeyValueStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
         *this,char *__filename)

{
  NotImplementedException *this_00;
  string local_30 [16];
  allocator<char> *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
             in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  supermap::NotImplementedException::NotImplementedException(this_00,local_30);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,
              NotImplementedException::~NotImplementedException);
}

Assistant:

virtual void remove(const Key &) {
        throw NotImplementedException("Remove for abstract KeyValueStorage");
    }